

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

client * workspace_list_find_window_client(workspace_list *list,xcb_window_t window)

{
  client *pcVar1;
  client *client;
  workspace *workspace;
  size_t i;
  xcb_window_t window_local;
  workspace_list *list_local;
  
  workspace = (workspace *)0x0;
  while( true ) {
    if ((workspace *)list->count <= workspace) {
      return (client *)0x0;
    }
    pcVar1 = workspace_find_window_client(list->workspaces[(long)workspace],window);
    if (pcVar1 != (client *)0x0) break;
    workspace = (workspace *)((long)&workspace->name + 1);
  }
  return pcVar1;
}

Assistant:

struct client *workspace_list_find_window_client(const struct workspace_list *list,
                                                 xcb_window_t window)
{
        for (size_t i = 0; i < list->count; ++i) {
                struct workspace *workspace = list->workspaces[i];
                struct client *client = workspace_find_window_client(workspace, window);

                if (client != NULL) {
                        return client;
                }
        }

        return NULL;
}